

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRasterizer.cpp
# Opt level: O0

void __thiscall
rr::TriangleRasterizer::rasterize
          (TriangleRasterizer *this,FragmentPacket *fragmentPackets,float *depthValues,
          int maxFragmentPackets,int *numPacketsRasterized)

{
  int *numPacketsRasterized_local;
  int maxFragmentPackets_local;
  float *depthValues_local;
  FragmentPacket *fragmentPackets_local;
  TriangleRasterizer *this_local;
  
  switch(this->m_numSamples) {
  case 1:
    rasterizeSingleSample(this,fragmentPackets,depthValues,maxFragmentPackets,numPacketsRasterized);
    break;
  case 2:
    rasterizeMultiSample<2>
              (this,fragmentPackets,depthValues,maxFragmentPackets,numPacketsRasterized);
    break;
  default:
    break;
  case 4:
    rasterizeMultiSample<4>
              (this,fragmentPackets,depthValues,maxFragmentPackets,numPacketsRasterized);
    break;
  case 8:
    rasterizeMultiSample<8>
              (this,fragmentPackets,depthValues,maxFragmentPackets,numPacketsRasterized);
    break;
  case 0x10:
    rasterizeMultiSample<16>
              (this,fragmentPackets,depthValues,maxFragmentPackets,numPacketsRasterized);
  }
  return;
}

Assistant:

void TriangleRasterizer::rasterize (FragmentPacket* const fragmentPackets, float* const depthValues, const int maxFragmentPackets, int& numPacketsRasterized)
{
	DE_ASSERT(maxFragmentPackets > 0);

	switch (m_numSamples)
	{
		case 1:		rasterizeSingleSample		(fragmentPackets, depthValues, maxFragmentPackets, numPacketsRasterized);	break;
		case 2:		rasterizeMultiSample<2>		(fragmentPackets, depthValues, maxFragmentPackets, numPacketsRasterized);	break;
		case 4:		rasterizeMultiSample<4>		(fragmentPackets, depthValues, maxFragmentPackets, numPacketsRasterized);	break;
		case 8:		rasterizeMultiSample<8>		(fragmentPackets, depthValues, maxFragmentPackets, numPacketsRasterized);	break;
		case 16:	rasterizeMultiSample<16>	(fragmentPackets, depthValues, maxFragmentPackets, numPacketsRasterized);	break;
		default:
			DE_ASSERT(DE_FALSE);
	}
}